

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O1

CFeeRate wallet::GetDiscardRate(CWallet *wallet)

{
  long lVar1;
  Chain *pCVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CFeeRate CVar7;
  long lVar8;
  long in_FS_OFFSET;
  long lVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (wallet->m_chain != (Chain *)0x0) {
    uVar4 = (*wallet->m_chain->_vptr_Chain[0x1c])();
    pCVar2 = wallet->m_chain;
    if (pCVar2 != (Chain *)0x0) {
      iVar5 = (*pCVar2->_vptr_Chain[0x1b])(pCVar2,(ulong)uVar4,0,0);
      lVar6 = CONCAT44(extraout_var,iVar5);
      if (wallet->m_chain != (Chain *)0x0) {
        lVar3 = (wallet->m_discard_rate).nSatoshisPerK;
        lVar8 = lVar6;
        if (lVar3 < lVar6) {
          lVar8 = lVar3;
        }
        if (lVar6 == 0) {
          lVar8 = lVar3;
        }
        iVar5 = (*wallet->m_chain->_vptr_Chain[0x20])();
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          CVar7.nSatoshisPerK = CONCAT44(extraout_var_00,iVar5);
          if (CONCAT44(extraout_var_00,iVar5) < lVar8) {
            CVar7.nSatoshisPerK = lVar8;
          }
          return (CFeeRate)CVar7.nSatoshisPerK;
        }
        __stack_chk_fail();
      }
    }
  }
  __assert_fail("m_chain",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
}

Assistant:

CFeeRate GetDiscardRate(const CWallet& wallet)
{
    unsigned int highest_target = wallet.chain().estimateMaxBlocks();
    CFeeRate discard_rate = wallet.chain().estimateSmartFee(highest_target, /*conservative=*/false);
    // Don't let discard_rate be greater than longest possible fee estimate if we get a valid fee estimate
    discard_rate = (discard_rate == CFeeRate(0)) ? wallet.m_discard_rate : std::min(discard_rate, wallet.m_discard_rate);
    // Discard rate must be at least dust relay feerate
    discard_rate = std::max(discard_rate, wallet.chain().relayDustFee());
    return discard_rate;
}